

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O3

string * __thiscall
SymbolTableTree::GetCurrentPreviousTableName_abi_cxx11_
          (string *__return_storage_ptr__,SymbolTableTree *this)

{
  pointer ppVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  pointer ppVar4;
  
  ppVar4 = (this->m_table_tree).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_table_tree).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SymbolTable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    pcVar2 = (this->current_table_name)._M_dataplus._M_p;
    __n = (this->current_table_name)._M_string_length;
    do {
      if ((ppVar4->first)._M_string_length == __n) {
        if (__n == 0) break;
        iVar3 = bcmp((ppVar4->first)._M_dataplus._M_p,pcVar2,__n);
        if (iVar3 == 0) break;
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (ppVar4->second).m_previous_level_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (ppVar4->second).m_previous_level_name._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string SymbolTableTree::GetCurrentPreviousTableName() const {
    auto iter = m_table_tree.begin();
    for (; iter != m_table_tree.end(); ++iter) {
        if (iter->first == current_table_name)
            break;
    }
    return iter->second.GetPreviousTableName();
}